

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

bool __thiscall ON_EmbeddedBitmap::Internal_WriteV5(ON_EmbeddedBitmap *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *pOVar1;
  bool bVar2;
  ON_FileReference *this_00;
  ON_wString *s;
  ON_UUID *uuid;
  undefined1 local_28 [16];
  int i;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_EmbeddedBitmap *this_local;
  
  local_28[0xf] = 0;
  _i = file;
  file_local = (ON_BinaryArchive *)this;
  bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,1);
  pOVar1 = _i;
  if (bVar2) {
    this_00 = ON_Bitmap::FileReference(&this->super_ON_Bitmap);
    s = ON_FileReference::FullPath(this_00);
    bVar2 = ON_BinaryArchive::WriteString(pOVar1,s);
    if ((bVar2) && (bVar2 = ON_BinaryArchive::WriteInt(_i,this->m_buffer_crc32), bVar2)) {
      local_28._8_4_ = 1;
      bVar2 = ON_BinaryArchive::WriteInt(_i,1);
      if ((bVar2) &&
         (bVar2 = ON_BinaryArchive::WriteCompressedBuffer(_i,this->m_sizeof_buffer,this->m_buffer),
         pOVar1 = _i, bVar2)) {
        uuid = ON_ModelComponent::Id((ON_ModelComponent *)this);
        bVar2 = ON_BinaryArchive::WriteUuid(pOVar1,uuid);
        pOVar1 = _i;
        if (bVar2) {
          ON_ModelComponent::Name((ON_ModelComponent *)local_28);
          bVar2 = ON_BinaryArchive::WriteString(pOVar1,(ON_wString *)local_28);
          ON_wString::~ON_wString((ON_wString *)local_28);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_28[0xf] = 1;
          }
        }
      }
    }
  }
  return (bool)(local_28[0xf] & 1);
}

Assistant:

bool ON_EmbeddedBitmap::Internal_WriteV5( ON_BinaryArchive& file ) const 
{
  bool rc = false;
  for (;;)
  {
    if (!file.Write3dmChunkVersion(1, 1))
      break;

    if (!file.WriteString( FileReference().FullPath() ) )
      break;

    if (!file.WriteInt(m_buffer_crc32))
      break;

    const int i = 1; // 1 = compressed
    if (!file.WriteInt(i))
      break;

    if (!file.WriteCompressedBuffer(m_sizeof_buffer, m_buffer))
      break;

    // version 1.1 added id and name
    if (!file.WriteUuid(Id()))
      break;
    if (!file.WriteString(Name()))
      break;

    rc = true;
    break;
  }

  return rc;
}